

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeConstraintError(Rtree *pRtree,int iCol)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  char *zCol2;
  char *zCol1;
  char *zCol;
  int rc;
  char *zSql;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  sqlite3_stmt *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xaaaaaaaa;
  pcVar3 = sqlite3_mprintf("SELECT * FROM %Q.%Q",*(undefined8 *)(in_RDI + 0x30),
                           *(undefined8 *)(in_RDI + 0x38));
  if (pcVar3 == (char *)0x0) {
    iVar2 = 7;
  }
  else {
    iVar2 = sqlite3_prepare_v2((sqlite3 *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffc8,iVar2,
                               (sqlite3_stmt **)in_stack_ffffffffffffffb8,
                               (char **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0
                                                ));
  }
  sqlite3_free((void *)0x29c382);
  if (iVar2 == 0) {
    if (in_ESI == 0) {
      pcVar3 = sqlite3_column_name((sqlite3_stmt *)
                                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                   in_stack_ffffffffffffffac);
      pcVar3 = sqlite3_mprintf("UNIQUE constraint failed: %s.%s",*(undefined8 *)(in_RDI + 0x38),
                               pcVar3);
      *(char **)(in_RDI + 0x10) = pcVar3;
    }
    else {
      pcVar3 = sqlite3_column_name((sqlite3_stmt *)
                                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                   in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffb8 =
           (sqlite3_stmt *)
           sqlite3_column_name((sqlite3_stmt *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffac);
      pcVar3 = sqlite3_mprintf("rtree constraint failed: %s.(%s<=%s)",*(undefined8 *)(in_RDI + 0x38)
                               ,pcVar3,in_stack_ffffffffffffffb8);
      *(char **)(in_RDI + 0x10) = pcVar3;
    }
  }
  sqlite3_finalize(in_stack_ffffffffffffffb8);
  if (iVar2 == 0) {
    iVar2 = 0x13;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int rtreeConstraintError(Rtree *pRtree, int iCol){
  sqlite3_stmt *pStmt = 0;
  char *zSql;
  int rc;

  assert( iCol==0 || iCol%2 );
  zSql = sqlite3_mprintf("SELECT * FROM %Q.%Q", pRtree->zDb, pRtree->zName);
  if( zSql ){
    rc = sqlite3_prepare_v2(pRtree->db, zSql, -1, &pStmt, 0);
  }else{
    rc = SQLITE_NOMEM;
  }
  sqlite3_free(zSql);

  if( rc==SQLITE_OK ){
    if( iCol==0 ){
      const char *zCol = sqlite3_column_name(pStmt, 0);
      pRtree->base.zErrMsg = sqlite3_mprintf(
          "UNIQUE constraint failed: %s.%s", pRtree->zName, zCol
      );
    }else{
      const char *zCol1 = sqlite3_column_name(pStmt, iCol);
      const char *zCol2 = sqlite3_column_name(pStmt, iCol+1);
      pRtree->base.zErrMsg = sqlite3_mprintf(
          "rtree constraint failed: %s.(%s<=%s)", pRtree->zName, zCol1, zCol2
      );
    }
  }

  sqlite3_finalize(pStmt);
  return (rc==SQLITE_OK ? SQLITE_CONSTRAINT : rc);
}